

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

bool __thiscall
nuraft::FakeNetwork::makeReqFail(FakeNetwork *this,string *endpoint,bool random_order)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *this_00;
  SimpleLogger *this_01;
  int extraout_var;
  element_type *peVar4;
  undefined8 uVar5;
  byte in_DL;
  ptr<rpc_exception> exp;
  ptr<resp_msg> rsp;
  SimpleLogger *ll;
  ReqPkg *pkg;
  iterator pkg_entry;
  ptr<FakeClient> conn;
  list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
  *in_stack_fffffffffffffe28;
  strfmt<100> *in_stack_fffffffffffffe30;
  const_iterator in_stack_fffffffffffffe38;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  _List_const_iterator<nuraft::FakeNetwork::ReqPkg> local_148;
  string local_140 [32];
  strfmt<100> local_120;
  char *local_b0;
  string local_88 [36];
  msg_type in_stack_ffffffffffffff9c;
  _Self local_40;
  _Self local_38 [3];
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  findClient((FakeNetwork *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70);
  std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b6af4);
  local_38[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
       ::begin(in_stack_fffffffffffffe28);
  std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b6b15);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>
       ::end(in_stack_fffffffffffffe28);
  iVar3 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  bVar1 = std::operator==(local_38,&local_40);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    std::_List_iterator<nuraft::FakeNetwork::ReqPkg>::operator*
              ((_List_iterator<nuraft::FakeNetwork::ReqPkg> *)0x1b6b69);
    this_00 = std::
              __shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b6b82);
    this_01 = FakeNetworkBase::getLogger(this_00);
    if (this_01 != (SimpleLogger *)0x0) {
      iVar2 = SimpleLogger::getLogLevel((SimpleLogger *)in_stack_fffffffffffffe38._M_node);
      if (3 < iVar2) {
        std::__cxx11::string::c_str();
        in_stack_fffffffffffffe30 = (strfmt<100> *)std::__cxx11::string::c_str();
        peVar4 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b6c0f);
        msg_base::get_type(&peVar4->super_msg_base);
        msg_type_to_string_abi_cxx11_(in_stack_ffffffffffffff9c);
        in_stack_fffffffffffffe38._M_node = (_List_node_base *)std::__cxx11::string::c_str();
        iVar3 = extraout_var;
        SimpleLogger::put(this_01,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                          ,"makeReqFail",0xc6,"[BEGIN] make request %s -> %s failed, %s");
        std::__cxx11::string::~string(local_88);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1b6ce1);
    strfmt<100>::strfmt(&local_120,"failed to send request to peer %d");
    peVar4 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b6d04);
    msg_base::get_dst(&peVar4->super_msg_base);
    local_b0 = strfmt<100>::fmt<int>(in_stack_fffffffffffffe30,iVar3);
    cs_new<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)in_stack_fffffffffffffe38._M_node,
               (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffe30);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(in_stack_fffffffffffffe40,
               (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffe38._M_node,
               (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffe30);
    if (this_01 != (SimpleLogger *)0x0) {
      iVar3 = SimpleLogger::getLogLevel((SimpleLogger *)in_stack_fffffffffffffe38._M_node);
      if (3 < iVar3) {
        uVar5 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffe30 = (strfmt<100> *)std::__cxx11::string::c_str();
        peVar4 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b6dea);
        msg_base::get_type(&peVar4->super_msg_base);
        msg_type_to_string_abi_cxx11_(in_stack_ffffffffffffff9c);
        in_stack_fffffffffffffe38._M_node = (_List_node_base *)std::__cxx11::string::c_str();
        SimpleLogger::put(this_01,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                          ,"makeReqFail",0xd2,"[END] make request %s -> %s failed, %s",uVar5);
        std::__cxx11::string::~string(local_140);
      }
    }
    std::__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b6ed2);
    std::_List_const_iterator<nuraft::FakeNetwork::ReqPkg>::_List_const_iterator
              (&local_148,local_38);
    std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::
    erase((list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *)
          in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
    local_1 = 1;
    std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
              ((shared_ptr<nuraft::rpc_exception> *)0x1b6f2a);
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1b6f37);
  }
  std::shared_ptr<nuraft::FakeClient>::~shared_ptr((shared_ptr<nuraft::FakeClient> *)0x1b6f62);
  return (bool)(local_1 & 1);
}

Assistant:

bool FakeNetwork::makeReqFail(const std::string& endpoint,
                              bool random_order)
{
    // this:                    source (sending request)
    // conn->dstNet (endpoint): destination (sending response)
    ptr<FakeClient> conn = findClient(endpoint);

    auto pkg_entry = conn->pendingReqs.begin();
    if (pkg_entry == conn->pendingReqs.end()) return false;

    ReqPkg& pkg = *pkg_entry;

    SimpleLogger* ll = base->getLogger();
    _log_info(ll, "[BEGIN] make request %s -> %s failed, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    ptr<resp_msg> rsp; // empty.
    ptr<rpc_exception> exp
        ( cs_new<rpc_exception>
          ( sstrfmt( "failed to send request to peer %d" )
                   .fmt( pkg.req->get_dst() ),
            pkg.req ) );
    pkg.whenDone( rsp, exp );

    _log_info(ll, "[END] make request %s -> %s failed, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    conn->pendingReqs.erase(pkg_entry);
    return true;
}